

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  PcodeOp *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  OpCode OVar7;
  OpCode OVar8;
  pointer ppVVar9;
  OpCode OVar10;
  pointer ppVVar11;
  
  do {
    if (vn1 == vn2) {
      return true;
    }
    if (((vn1->flags & 0x10) == 0) || ((vn2->flags & 0x10) == 0)) {
      if (((vn1->flags & 2) != 0) && ((vn2->flags & 2) != 0)) {
        return (vn1->loc).offset == (vn2->loc).offset;
      }
      bVar4 = isPossibleAliasStep(vn1,vn2);
      return bVar4;
    }
    bVar4 = isPossibleAliasStep(vn1,vn2);
    if (!bVar4) {
      return false;
    }
    pPVar2 = vn1->def;
    OVar1 = pPVar2->opcode->opcode;
    OVar7 = CPUI_INT_ADD;
    iVar5 = 1;
    OVar8 = OVar7;
    iVar6 = iVar5;
    if ((OVar1 != CPUI_PTRSUB) && (OVar8 = OVar1, OVar1 == CPUI_PTRADD)) {
      OVar8 = OVar7;
      iVar6 = (int)((pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
    }
    pPVar3 = vn2->def;
    OVar1 = pPVar3->opcode->opcode;
    OVar10 = OVar7;
    if ((OVar1 != CPUI_PTRSUB) && (OVar10 = OVar1, OVar1 == CPUI_PTRADD)) {
      iVar5 = (int)((pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
      OVar10 = OVar7;
    }
    bVar4 = depth == 0;
    depth = depth + -1;
    if (bVar4) {
      return true;
    }
    if (OVar8 != OVar10) {
      return true;
    }
    if (CPUI_INT_NEGATE < OVar8) {
      return true;
    }
    if ((0x3060002U >> (OVar8 & CPUI_INT_SRIGHT) & 1) != 0) {
      ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_0030f8e7;
    }
    if (OVar8 != CPUI_INT_ADD) {
      return true;
    }
    ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar11 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (((ppVVar9[1]->flags & 2) == 0) || ((ppVVar11[1]->flags & 2) == 0)) {
      if (iVar6 != iVar5) {
        return true;
      }
      bVar4 = functionalEquality(*ppVVar9,*ppVVar11);
      ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      if (bVar4) {
LAB_0030f939:
        ppVVar11 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
      }
      else {
        bVar4 = functionalEquality(*ppVVar9,(pPVar3->inrefs).
                                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1]);
        ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        if (!bVar4) {
          bVar4 = functionalEquality(*ppVVar9,(pPVar3->inrefs).
                                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1]);
          ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          if (!bVar4) {
            bVar4 = functionalEquality(*ppVVar9,*(pPVar3->inrefs).
                                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
            if (!bVar4) {
              return true;
            }
            ppVVar9 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            goto LAB_0030f939;
          }
        }
LAB_0030f8e7:
        ppVVar11 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      }
    }
    else if ((long)iVar6 * (ppVVar9[1]->loc).offset - (long)iVar5 * (ppVVar11[1]->loc).offset != 0)
    {
      bVar4 = functionalEquality(*ppVVar9,*ppVVar11);
      return !bVar4;
    }
    vn2 = *ppVVar11;
    vn1 = *ppVVar9;
  } while( true );
}

Assistant:

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  if (vn1 == vn2) return true;	// Definite alias
  if ((!vn1->isWritten())||(!vn2->isWritten())) {
    if (vn1->isConstant() && vn2->isConstant())
      return (vn1->getOffset()==vn2->getOffset()); // FIXME: these could be NEAR each other and still have an alias
    return isPossibleAliasStep(vn1,vn2);
  }

  if (!isPossibleAliasStep(vn1,vn2))
    return false;
  Varnode *cvn1,*cvn2;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc1 = op1->code();
  OpCode opc2 = op2->code();
  int4 mult1 = 1;
  int4 mult2 = 1;
  if (opc1 == CPUI_PTRSUB)
    opc1 = CPUI_INT_ADD;
  else if (opc1 == CPUI_PTRADD) {
    opc1 = CPUI_INT_ADD;
    mult1 = (int4) op1->getIn(2)->getOffset();
  }
  if (opc2 == CPUI_PTRSUB)
    opc2 = CPUI_INT_ADD;
  else if (opc2 == CPUI_PTRADD) {
    opc2 = CPUI_INT_ADD;
    mult2 = (int4) op2->getIn(2)->getOffset();
  }
  if (opc1 != opc2) return true;
  if (depth == 0) return true;	// Couldn't find absolute difference
  depth -= 1;
  switch(opc1) {
  case CPUI_COPY:
  case CPUI_INT_ZEXT:
  case CPUI_INT_SEXT:
  case CPUI_INT_2COMP:
  case CPUI_INT_NEGATE:
    return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
  case CPUI_INT_ADD:
    cvn1 = op1->getIn(1);
    cvn2 = op2->getIn(1);
    if (cvn1->isConstant() && cvn2->isConstant()) {
      uintb val1 = mult1 * cvn1->getOffset();
      uintb val2 = mult2 * cvn2->getOffset();
      if (val1 == val2)
	return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
      return !functionalEquality(op1->getIn(0),op2->getIn(0));
    }
    if (mult1 != mult2) return true;
    if (functionalEquality(op1->getIn(0),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(1),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(0),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(1),depth);
    break;
  default:
    break;
  }
  return true;
}